

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::OnAtomicRmwCmpxchgExpr
          (ExprVisitorDelegate *this,AtomicRmwCmpxchgExpr *expr)

{
  AtomicRmwCmpxchgExpr *expr_local;
  ExprVisitorDelegate *this_local;
  
  (anonymous_namespace)::WatWriter::WriteLoadStoreExpr<wabt::LoadStoreExpr<(wabt::ExprType)2>>
            ((WatWriter *)this->writer_,(Expr *)expr);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result WatWriter::ExprVisitorDelegate::OnAtomicRmwCmpxchgExpr(
    AtomicRmwCmpxchgExpr* expr) {
  writer_->WriteLoadStoreExpr<AtomicRmwCmpxchgExpr>(expr);
  return Result::Ok;
}